

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_locate_node(REF_INTERP ref_interp,REF_INT node)

{
  REF_AGENT_MODE RVar1;
  int iVar2;
  int iVar3;
  REF_INT *pRVar4;
  REF_MPI pRVar5;
  REF_INT *pRVar6;
  REF_AGENTS ref_agents;
  REF_AGENT_STRUCT *pRVar7;
  REF_DBL *pRVar8;
  REF_CELL pRVar9;
  uint uVar10;
  uint uVar11;
  undefined8 uVar12;
  long lVar13;
  char *pcVar14;
  bool bVar15;
  REF_INT id;
  REF_LIST ref_list;
  int local_4c;
  REF_DBL *local_48;
  REF_NODE local_40;
  REF_LIST local_38;
  
  if (ref_interp == (REF_INTERP)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x74f,
           "ref_interp_locate_node","ref_interp NULL");
    return 2;
  }
  if (ref_interp->max < node) {
    pcVar14 = "more nodes added, should move only";
    uVar12 = 0x752;
    goto LAB_001a2295;
  }
  pRVar4 = ref_interp->cell;
  if (pRVar4[node] == -1) {
    return 0;
  }
  pRVar5 = ref_interp->ref_mpi;
  pRVar6 = ref_interp->part;
  if (pRVar5->id != pRVar6[node]) {
    return 0;
  }
  ref_agents = ref_interp->ref_agents;
  if ((long)ref_agents->n != 0) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x75b,
           "ref_interp_locate_node","did not expect active agents",0,(long)ref_agents->n);
    return 1;
  }
  local_40 = ref_interp->to_grid->node;
  ref_interp->agent_hired[node] = 1;
  local_48 = (REF_DBL *)((long)(node * 0xf) * 8);
  uVar10 = ref_agents_push(ref_agents,node,pRVar6[node],pRVar4[node],local_40->real + node * 0xf,
                           &local_4c);
  if (uVar10 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x761,
           "ref_interp_locate_node",(ulong)uVar10,"requeue");
    return uVar10;
  }
  RVar1 = ref_agents->agent[local_4c].mode;
  if ((ulong)RVar1 != 1) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x762,
           "ref_interp_locate_node","should be walking",1,(ulong)RVar1);
  }
  uVar10 = 1;
  if (RVar1 != REF_AGENT_WALKING) {
    return 1;
  }
  uVar11 = ref_interp_walk_agent(ref_interp,local_4c);
  if (uVar11 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x763,
           "ref_interp_locate_node",(ulong)uVar11,"walking");
    return uVar11;
  }
  pRVar7 = ref_agents->agent;
  if (pRVar7[local_4c].mode == REF_AGENT_ENCLOSING) {
    ref_interp->cell[node] = pRVar7[local_4c].seed;
    pRVar4 = ref_interp->part;
    pRVar4[node] = pRVar7[local_4c].part;
    pRVar8 = ref_interp->bary;
    lVar13 = 0;
    do {
      pRVar8[node * 4 + lVar13] = pRVar7[local_4c].bary[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    ref_interp->walk_steps = pRVar7[local_4c].step + ref_interp->walk_steps + 1;
    ref_interp->n_walk = ref_interp->n_walk + 1;
    iVar2 = pRVar5->id;
    iVar3 = pRVar4[node];
    if (iVar2 != iVar3) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x76b,"ref_interp_locate_node","expected local",(long)iVar2,(long)iVar3);
      return 1;
    }
    iVar2 = ref_interp->cell[node];
    if (ref_interp->from_grid->twod == 0) {
      if (((iVar2 < 0) || (pRVar9 = ref_interp->from_tet, pRVar9->max <= iVar2)) ||
         (pRVar9->c2n[(long)pRVar9->size_per * (long)iVar2] == -1)) {
        pcVar14 = "expected a valid tet";
        uVar12 = 0x773;
        goto LAB_001a2295;
      }
    }
    else if (((iVar2 < 0) || (pRVar9 = ref_interp->from_tri, pRVar9->max <= iVar2)) ||
            (pRVar9->c2n[(long)pRVar9->size_per * (long)iVar2] == -1)) {
      pcVar14 = "expected a valid tri";
      uVar12 = 0x76f;
LAB_001a2295:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar12,"ref_interp_locate_node",pcVar14);
      return 1;
    }
  }
  else {
    ref_interp->cell[node] = -1;
  }
  ref_interp->agent_hired[node] = 0;
  uVar11 = ref_agents_remove(ref_agents,local_4c);
  if (uVar11 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x77b,
           "ref_interp_locate_node",(ulong)uVar11,"no longer needed");
    return uVar11;
  }
  if ((1 < local_40->ref_mpi->n) || (ref_interp->cell[node] != -1)) goto LAB_001a26e9;
  uVar11 = ref_list_create(&local_38);
  if (uVar11 == 0) {
    uVar11 = ref_search_touching(ref_interp->ref_search,local_38,
                                 (REF_DBL *)((long)local_40->real + (long)local_48),
                                 ref_interp->search_fuzz);
    if (uVar11 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x785,"ref_interp_locate_node",(ulong)uVar11,"tch");
      goto LAB_001a26dd;
    }
    uVar11 = uVar10;
    if (0 < local_38->n) {
      local_48 = (REF_DBL *)((long)local_48 + (long)local_40->real);
      if (ref_interp->from_grid->twod == 0) {
        uVar10 = ref_interp_enclosing_tet_in_list
                           (ref_interp,local_38,local_48,ref_interp->cell + node,
                            ref_interp->bary + node * 4);
        if (uVar10 != 0) {
          pcVar14 = "best tet in list";
          uVar12 = 0x790;
          goto LAB_001a2801;
        }
      }
      else {
        uVar10 = ref_interp_enclosing_tri_in_list
                           (ref_interp,local_38,local_48,ref_interp->cell + node,
                            ref_interp->bary + node * 4);
        if (uVar10 != 0) {
          pcVar14 = "best tri in list";
          uVar12 = 0x78b;
LAB_001a2801:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar12,"ref_interp_locate_node",(ulong)uVar10,pcVar14);
          uVar11 = uVar10;
        }
      }
      if (uVar10 != 0) goto LAB_001a26dd;
    }
    uVar10 = ref_list_free(local_38);
    bVar15 = uVar10 == 0;
    if (!bVar15) {
      bVar15 = false;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x793,"ref_interp_locate_node",(ulong)uVar10,"free list");
      uVar11 = uVar10;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x781,
           "ref_interp_locate_node",(ulong)uVar11,"create list");
LAB_001a26dd:
    bVar15 = false;
  }
  if (!bVar15) {
    return uVar11;
  }
LAB_001a26e9:
  return (uint)(ref_interp->cell[node] == -1) * 5;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_node(REF_INTERP ref_interp, REF_INT node) {
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_AGENTS ref_agents;
  REF_INT i, id;
  RNS(ref_interp, "ref_interp NULL");
  ref_mpi = ref_interp_mpi(ref_interp);

  RAS(node <= ref_interp_max(ref_interp), "more nodes added, should move only");

  /* no starting guess, skip */
  if (REF_EMPTY == ref_interp->cell[node] ||
      ref_mpi_rank(ref_mpi) != ref_interp->part[node])
    return REF_SUCCESS;

  ref_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  ref_agents = ref_interp->ref_agents;
  REIS(0, ref_agents_n(ref_agents), "did not expect active agents");

  ref_interp->agent_hired[node] = REF_TRUE;
  RSS(ref_agents_push(ref_agents, node, ref_interp->part[node],
                      ref_interp->cell[node], ref_node_xyz_ptr(ref_node, node),
                      &id),
      "requeue");
  REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "should be walking");
  RSS(ref_interp_walk_agent(ref_interp, id), "walking");
  if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id)) {
    ref_interp->cell[node] = ref_agent_seed(ref_agents, id);
    ref_interp->part[node] = ref_agent_part(ref_agents, id);
    for (i = 0; i < 4; i++)
      ref_interp->bary[i + 4 * node] = ref_agent_bary(ref_agents, i, id);
    (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
    (ref_interp->n_walk)++;
    REIS(ref_mpi_rank(ref_mpi), ref_interp->part[node], "expected local");
    if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
      RAS(ref_cell_valid(ref_interp_from_tri(ref_interp),
                         ref_interp->cell[node]),
          "expected a valid tri");
    } else {
      RAS(ref_cell_valid(ref_interp_from_tet(ref_interp),
                         ref_interp->cell[node]),
          "expected a valid tet");
    }
  } else {
    /* new seed or go exhaustive for REF_AGENT_AT_BOUNDARY */
    /* what for parallel REF_AGENT_HOP_PART */
    ref_interp->cell[node] = REF_EMPTY;
  }
  ref_interp->agent_hired[node] = REF_FALSE; /* dismissed */
  RSS(ref_agents_remove(ref_agents, id), "no longer needed");

  if (!ref_mpi_para(ref_node_mpi(ref_node)) &&
      REF_EMPTY == ref_interp->cell[node]) {
    REF_LIST ref_list;

    RSS(ref_list_create(&ref_list), "create list");
    RSS(ref_search_touching(ref_interp_search(ref_interp), ref_list,
                            ref_node_xyz_ptr(ref_node, node),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
        RSS(ref_interp_enclosing_tri_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "best tri in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "best tet in list");
      }
    }
    RSS(ref_list_free(ref_list), "free list");
  }

  if (REF_EMPTY == ref_interp->cell[node]) {
    return REF_NOT_FOUND;
  }
  return REF_SUCCESS;
}